

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::setTolerances
          (SPxSolverBase<double> *this,shared_ptr<soplex::Tolerances> *newTolerances)

{
  (this->super_SPxLPBase<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (newTolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_SPxLPBase<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(newTolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  UpdateVector<double>::setTolerances(&this->primVec,newTolerances);
  UpdateVector<double>::setTolerances(&this->dualVec,newTolerances);
  UpdateVector<double>::setTolerances(&this->addVec,newTolerances);
  UpdateVector<double>::setTolerances(this->theFvec,newTolerances);
  UpdateVector<double>::setTolerances(this->theCoPvec,newTolerances);
  UpdateVector<double>::setTolerances(this->thePvec,newTolerances);
  UpdateVector<double>::setTolerances(this->theRPvec,newTolerances);
  UpdateVector<double>::setTolerances(this->theCPvec,newTolerances);
  return;
}

Assistant:

virtual void setTolerances(std::shared_ptr<Tolerances> newTolerances)
   {
      this->_tolerances = newTolerances;
      // set tolerances for all the UpdateVectors
      this->primVec.setTolerances(newTolerances);
      this->dualVec.setTolerances(newTolerances);
      this->addVec.setTolerances(newTolerances);
      this->theFvec->setTolerances(newTolerances);
      this->theCoPvec->setTolerances(newTolerances);
      this->thePvec->setTolerances(newTolerances);
      this->theRPvec->setTolerances(newTolerances);
      this->theCPvec->setTolerances(newTolerances);
   }